

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O0

QSize __thiscall QCommandLinkButton::sizeHint(QCommandLinkButton *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QCommandLinkButtonPrivate *this_00;
  int *piVar5;
  QAbstractButton *in_RDI;
  long in_FS_OFFSET;
  int heightWithoutDescription;
  int textWidth;
  QCommandLinkButtonPrivate *d;
  int buttonWidth;
  QFontMetrics fm;
  QSize size;
  undefined1 *puVar6;
  int w;
  QSize *this_01;
  QCommandLinkButtonPrivate *this_02;
  int widgetWidth;
  undefined4 in_stack_ffffffffffffff60;
  int iVar7;
  undefined4 in_stack_ffffffffffffff64;
  QPushButton *in_stack_ffffffffffffff78;
  QFontMetrics *this_03;
  int local_5c;
  int local_58;
  int local_54;
  int local_50 [2];
  undefined1 local_48 [32];
  undefined1 *local_28;
  QSize local_20;
  QSize local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QCommandLinkButton *)0x556250);
  puVar6 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QPushButton::sizeHint(in_stack_ffffffffffffff78);
  this_01 = local_18;
  local_28 = puVar6;
  QCommandLinkButtonPrivate::titleFont
            ((QCommandLinkButtonPrivate *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  w = (int)((ulong)puVar6 >> 0x20);
  this_03 = (QFontMetrics *)(local_48 + 0x20);
  QFontMetrics::QFontMetrics(this_03,(QFont *)this_01);
  QFont::~QFont((QFont *)this_01);
  this_02 = (QCommandLinkButtonPrivate *)local_48;
  QAbstractButton::text(in_RDI);
  local_48._28_4_ = QFontMetrics::horizontalAdvance((QString *)this_03,(int)this_02);
  local_50[1] = 0x87;
  piVar5 = qMax<int>((int *)(local_48 + 0x1c),local_50 + 1);
  widgetWidth = *piVar5;
  QString::~QString((QString *)0x556320);
  iVar7 = widgetWidth;
  iVar2 = QCommandLinkButtonPrivate::textOffset
                    ((QCommandLinkButtonPrivate *)CONCAT44(in_stack_ffffffffffffff64,widgetWidth));
  iVar2 = iVar7 + iVar2;
  local_50[0] = QCommandLinkButtonPrivate::rightMargin(this_00);
  local_50[0] = iVar2 + local_50[0];
  iVar3 = QCommandLinkButtonPrivate::descriptionOffset(this_02);
  iVar4 = QCommandLinkButtonPrivate::bottomMargin(this_00);
  local_54 = QSize::width((QSize *)0x556392);
  qMax<int>(&local_54,local_50);
  QSize::setWidth(this_01,w);
  bVar1 = QString::isEmpty((QString *)0x5563c2);
  local_58 = 0x3c;
  if (bVar1) {
    local_58 = 0x29;
  }
  local_5c = QCommandLinkButtonPrivate::descriptionHeight
                       ((QCommandLinkButtonPrivate *)CONCAT44(iVar2,iVar7),widgetWidth);
  local_5c = iVar3 + iVar4 + local_5c;
  qMax<int>(&local_58,&local_5c);
  QSize::setHeight(this_01,w);
  QFontMetrics::~QFontMetrics(this_03);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

QSize QCommandLinkButton::sizeHint() const
{
//  Standard size hints from UI specs
//  Without note: 135, 41
//  With note: 135, 60
    Q_D(const QCommandLinkButton);

    QSize size = QPushButton::sizeHint();
    QFontMetrics fm(d->titleFont());
    int textWidth = qMax(fm.horizontalAdvance(text()), 135);
    int buttonWidth = textWidth + d->textOffset() + d->rightMargin();
    int heightWithoutDescription = d->descriptionOffset() + d->bottomMargin();

    size.setWidth(qMax(size.width(), buttonWidth));
    size.setHeight(qMax(d->description.isEmpty() ? 41 : 60,
                        heightWithoutDescription + d->descriptionHeight(buttonWidth)));
    return size;
}